

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear-algebra.cc
# Opt level: O0

vector3f tinyusdz::vnormalize(vector3f *a,float eps)

{
  vector3f vVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float local_3c;
  float len;
  float eps_local;
  vector3f *a_local;
  
  fVar2 = vlength(a);
  local_3c = eps;
  if (eps < fVar2) {
    local_3c = fVar2;
  }
  fVar2 = value::vector3f::operator[](a,0);
  fVar3 = value::vector3f::operator[](a,1);
  fVar4 = value::vector3f::operator[](a,2);
  vVar1.y = fVar3 / local_3c;
  vVar1.x = fVar2 / local_3c;
  vVar1.z = fVar4 / local_3c;
  return vVar1;
}

Assistant:

value::vector3f vnormalize(const value::vector3f &a, const float eps) {
  float len = vlength(a);
  len = (len > eps) ? len : eps;
  return value::vector3f({a[0] / len, a[1] / len, a[2] / len});
}